

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterferentGraphBuilder.cpp
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
* AssemblyCode::buildInterferentGraph
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             *__return_storage_ptr__,
            vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_> *lines,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *ignoreList)

{
  _Rb_tree_header *p_Var1;
  pointer pCVar2;
  pointer pCVar3;
  CodeLine line;
  CodeLine local_e0;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  addVertices(lines,__return_storage_ptr__,ignoreList);
  pCVar3 = (lines->
           super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (lines->
           super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pCVar3 != pCVar2) {
    do {
      CodeLine::CodeLine(&local_e0,pCVar3);
      processLine(&local_e0,__return_storage_ptr__,ignoreList);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_e0.liveOutTemps._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_e0.liveInTemps._M_t);
      if (local_e0.prevLines.
          super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.prevLines.
                        super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e0.nextLines.
          super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.nextLines.
                        super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e0.command.
          super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e0.command.
                   super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pCVar3 = pCVar3 + 1;
    } while (pCVar3 != pCVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::set<std::string>> AssemblyCode::buildInterferentGraph(std::vector<AssemblyCode::CodeLine>& lines,
                                                                                 std::vector<std::string>& ignoreList) {
    std::map<std::string, std::set<std::string>> graph;

    addVertices(lines, graph, ignoreList);

    for (auto line : lines) {
        processLine(line, graph, ignoreList);
    }

    return graph;
}